

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer.c
# Opt level: O2

char * raviX_get_type_name(ravitype_t tt)

{
  switch(tt) {
  case ~RAVI_TANY:
  case RAVI_TFALSE:
  case RAVI_TFALSE|RAVI_TNIL:
  case RAVI_TTRUE:
  case RAVI_TTRUE|RAVI_TNIL:
  case RAVI_TTRUE|RAVI_TFALSE:
    goto switchD_0011115d_caseD_0;
  case RAVI_TNIL:
    return "nil";
  case RAVI_TBOOLEAN:
    return "boolean";
  case RAVI_TNUMINT:
    return "integer";
  case RAVI_TANY:
    return "any";
  default:
    if (tt == RAVI_TNUMFLT) {
      return "number";
    }
    if (tt == RAVI_TARRAYINT) {
      return "integer[]";
    }
    if (tt == RAVI_TARRAYFLT) {
      return "number[]";
    }
    if (tt == RAVI_TTABLE) {
      return "table";
    }
    if (tt == RAVI_TSTRING) {
      return "string";
    }
    if (tt == RAVI_TFUNCTION) {
      return "closure";
    }
    if (tt == RAVI_TUSERDATA) {
      return "userdata";
    }
switchD_0011115d_caseD_0:
    return "?";
  }
}

Assistant:

const char *raviX_get_type_name(ravitype_t tt)
{
	switch (tt) {
	case RAVI_TANY:
		return "any";
	case RAVI_TNIL:
		return "nil";
	case RAVI_TBOOLEAN:
		return "boolean";
	case RAVI_TNUMFLT:
		return "number";
	case RAVI_TNUMINT:
		return "integer";
	case RAVI_TTABLE:
		return "table";
	case RAVI_TSTRING:
		return "string";
	case RAVI_TARRAYINT:
		return "integer[]";
	case RAVI_TARRAYFLT:
		return "number[]";
	case RAVI_TFUNCTION:
		return "closure";
	case RAVI_TUSERDATA:
		return "userdata";
	default:
		return "?";
	}
}